

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::EventLogEntry_Emit
               (EventLogEntry *evt,EventLogEntryVTableEntry *evtFPVTable,FileWriter *writer,
               ThreadContext *threadContext,Separator separator)

{
  fPtr_EventLogEntryInfoEmit emitFP;
  Separator separator_local;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntryVTableEntry *evtFPVTable_local;
  EventLogEntry *evt_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteTag<TTD::NSLogEvents::EventKind>(writer,eventKind,evt->EventKind,NoSeparator);
  FileWriter::WriteInt32(writer,eventResultStatus,evt->ResultStatus,CommaSeparator);
  FileWriter::WriteInt64(writer,eventTime,evt->EventTimeStamp,CommaSeparator);
  if (evtFPVTable[evt->EventKind].EmitFP != (fPtr_EventLogEntryInfoEmit)0x0) {
    (*evtFPVTable[evt->EventKind].EmitFP)(evt,writer,threadContext);
  }
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EventLogEntry_Emit(const EventLogEntry* evt, EventLogEntryVTableEntry* evtFPVTable, FileWriter* writer, ThreadContext* threadContext, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteTag<EventKind>(NSTokens::Key::eventKind, evt->EventKind);
            writer->WriteInt32(NSTokens::Key::eventResultStatus, evt->ResultStatus, NSTokens::Separator::CommaSeparator);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            writer->WriteInt64(NSTokens::Key::eventTime, evt->EventTimeStamp, NSTokens::Separator::CommaSeparator);
#endif

            auto emitFP = evtFPVTable[(uint32)evt->EventKind].EmitFP;
            if(emitFP != nullptr)
            {
                emitFP(evt, writer, threadContext);
            }

            writer->WriteRecordEnd();
        }